

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O2

void Gia_ObjSetLevelId(Gia_Man_t *p,int Id,int l)

{
  Vec_Int_t *p_00;
  
  p_00 = p->vLevels;
  Vec_IntFillExtra(p_00,Id + 1,l);
  if ((-1 < Id) && (Id < p_00->nSize)) {
    p_00->pArray[(uint)Id] = l;
    return;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
}

Assistant:

static inline void         Gia_ObjSetLevelId( Gia_Man_t * p, int Id, int l )   { Vec_IntSetEntry(p->vLevels, Id, l);                        }